

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

bool __thiscall
cmFileAPI::AddProjectQuery(cmFileAPI *this,ObjectKind kind,uint majorVersion,uint minorVersion)

{
  pointer *ppOVar1;
  iterator __position;
  uint uVar2;
  __normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
  _Var3;
  bool bVar4;
  bool bVar5;
  Object query;
  Object local_18;
  
  switch(kind) {
  case CodeModel:
    bVar5 = majorVersion != 2;
    bVar4 = minorVersion < 8;
    break;
  case ConfigureLog:
  case InternalTest:
    goto switchD_003b7941_caseD_1;
  case Cache:
    uVar2 = majorVersion ^ 2;
    goto LAB_003b795a;
  case CMakeFiles:
    bVar5 = majorVersion != 1;
    bVar4 = minorVersion < 2;
    break;
  case Toolchains:
    uVar2 = majorVersion ^ 1;
LAB_003b795a:
    if (uVar2 != 0 || minorVersion != 0) goto switchD_003b7941_caseD_1;
  default:
    goto switchD_003b7941_default;
  }
  if ((bool)(!bVar4 | bVar5)) {
switchD_003b7941_caseD_1:
    bVar5 = false;
  }
  else {
switchD_003b7941_default:
    local_18.Version = (unsigned_long)majorVersion;
    local_18.Kind = kind;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<cmFileAPI::Object*,std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>>,__gnu_cxx::__ops::_Iter_equals_val<cmFileAPI::Object_const>>
                      ((this->TopQuery).Known.
                       super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->TopQuery).Known.
                       super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_18);
    __position._M_current =
         (this->TopQuery).Known.
         super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var3._M_current == __position._M_current) {
      if (__position._M_current ==
          (this->TopQuery).Known.
          super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
        _M_realloc_insert<cmFileAPI::Object&>
                  ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)&this->TopQuery,
                   __position,&local_18);
      }
      else {
        *(ulong *)__position._M_current = CONCAT44(local_18._4_4_,local_18.Kind);
        (__position._M_current)->Version = local_18.Version;
        ppOVar1 = &(this->TopQuery).Known.
                   super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppOVar1 = *ppOVar1 + 1;
      }
      this->QueryExists = true;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool cmFileAPI::AddProjectQuery(cmFileAPI::ObjectKind kind,
                                unsigned majorVersion, unsigned minorVersion)
{
  switch (kind) {
    case ObjectKind::CodeModel:
      if (majorVersion != 2 || minorVersion > CodeModelV2Minor) {
        return false;
      }
      break;
    case ObjectKind::Cache:
      if (majorVersion != 2 || minorVersion > CacheV2Minor) {
        return false;
      }
      break;
    case ObjectKind::CMakeFiles:
      if (majorVersion != 1 || minorVersion > CMakeFilesV1Minor) {
        return false;
      }
      break;
    case ObjectKind::Toolchains:
      if (majorVersion != 1 || minorVersion > ToolchainsV1Minor) {
        return false;
      }
      break;
    // These cannot be requested by the project
    case ObjectKind::ConfigureLog:
    case ObjectKind::InternalTest:
      return false;
  }

  Object query;
  query.Kind = kind;
  query.Version = majorVersion;
  if (std::find(this->TopQuery.Known.begin(), this->TopQuery.Known.end(),
                query) == this->TopQuery.Known.end()) {
    this->TopQuery.Known.emplace_back(query);
    this->QueryExists = true;
  }

  return true;
}